

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O0

bool __thiscall iutest::TestResult::HasResult(TestResult *this,Type eType)

{
  bool bVar1;
  Type TVar2;
  pointer this_00;
  __normal_iterator<const_iutest::TestPartResult_*,_std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  Type eType_local;
  TestResult *this_local;
  
  end = std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::begin
                  (&this->m_test_part_results);
  local_30._M_current =
       (TestPartResult *)
       std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::end
                 (&this->m_test_part_results);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_iutest::TestPartResult_*,_std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>_>
              ::operator->(&end);
    TVar2 = TestPartResult::type(this_00);
    if (TVar2 == eType) break;
    __gnu_cxx::
    __normal_iterator<const_iutest::TestPartResult_*,_std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>_>
    ::operator++(&end);
  }
  return true;
}

Assistant:

bool HasResult(TestPartResult::Type eType) const
    {
        for( TestPartResults::const_iterator it=m_test_part_results.begin()
            , end=m_test_part_results.end(); it != end; ++it )
        {
            if( it->type() == eType )
            {
                return true;
            }
        }
        return false;
    }